

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aloptional.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
al::optional<std::__cxx11::string>::value_or<char_const(&)[9]>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,optional<std::__cxx11::string> *this,char (*defval) [9])

{
  allocator local_9;
  
  if (*this == (optional<std::__cxx11::string>)0x1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)(this + 8));
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,*defval,&local_9);
  }
  return __return_storage_ptr__;
}

Assistant:

T value_or(U&& defval) &&
    { return bool{*this} ? std::move(**this) : static_cast<T>(std::forward<U>(defval)); }